

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::FileDescriptorProto::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ulong uVar2;
  _func_int **pp_Var3;
  MessageLite *pMVar4;
  MessageLite *pMVar5;
  char *failure_msg;
  void *pvVar6;
  int line;
  Arena *pAVar7;
  Arena *arena;
  FileDescriptorProto *_this;
  FileDescriptorProto *local_30;
  MessageLite *local_28 [2];
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_30 = (FileDescriptorProto *)to_msg;
  local_28[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<google::protobuf::FileDescriptorProto_const*,google::protobuf::FileDescriptorProto*>
                          ((FileDescriptorProto **)local_28,&local_30,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    line = 0xc4f;
LAB_00174487:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,line,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28)
    ;
  }
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&(local_30->field_0)._impl_.dependency_,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&from_msg[1]._internal_metadata_);
  RepeatedPtrField<google::protobuf::DescriptorProto>::MergeFrom
            (&(local_30->field_0)._impl_.message_type_,
             (RepeatedPtrField<google::protobuf::DescriptorProto> *)(from_msg + 3));
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::MergeFrom
            (&(local_30->field_0)._impl_.enum_type_,
             (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)
             &from_msg[4]._internal_metadata_);
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::MergeFrom
            (&(local_30->field_0)._impl_.service_,
             (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)(from_msg + 6));
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::MergeFrom
            (&(local_30->field_0)._impl_.extension_,
             (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
             &from_msg[7]._internal_metadata_);
  RepeatedField<int>::MergeFrom
            (&(local_30->field_0)._impl_.public_dependency_,(RepeatedField<int> *)(from_msg + 9));
  RepeatedField<int>::MergeFrom
            (&(local_30->field_0)._impl_.weak_dependency_,(RepeatedField<int> *)(from_msg + 10));
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&(local_30->field_0)._impl_.option_dependency_,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(from_msg + 0xb));
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      uVar2 = from_msg[0xc]._internal_metadata_.ptr_;
      (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 1;
      pAVar7 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(local_30->field_0)._impl_.name_,(string *)(uVar2 & 0xfffffffffffffffc),pAVar7);
    }
    if ((uVar1 & 2) != 0) {
      pp_Var3 = from_msg[0xd]._vptr_MessageLite;
      (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 2;
      pAVar7 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(local_30->field_0)._impl_.package_,
                 (string *)((ulong)pp_Var3 & 0xfffffffffffffffc),pAVar7);
    }
    if ((uVar1 & 4) != 0) {
      uVar2 = from_msg[0xd]._internal_metadata_.ptr_;
      (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 4;
      pAVar7 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(local_30->field_0)._impl_.syntax_,(string *)(uVar2 & 0xfffffffffffffffc),pAVar7);
    }
    if ((uVar1 & 8) != 0) {
      pMVar4 = (MessageLite *)from_msg[0xe]._vptr_MessageLite;
      if (pMVar4 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.options_ != nullptr";
        line = 0xc6b;
        goto LAB_00174487;
      }
      pMVar5 = *(MessageLite **)((long)&local_30->field_0 + 0xd0);
      if (pMVar5 == (MessageLite *)0x0) {
        pvVar6 = Arena::CopyConstruct<google::protobuf::FileOptions>(arena,pMVar4);
        *(void **)((long)&local_30->field_0 + 0xd0) = pvVar6;
      }
      else {
        FileOptions::MergeImpl(pMVar5,pMVar4);
      }
    }
    if ((uVar1 & 0x10) != 0) {
      pMVar4 = (MessageLite *)from_msg[0xe]._internal_metadata_.ptr_;
      if (pMVar4 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.source_code_info_ != nullptr";
        line = 0xc73;
        goto LAB_00174487;
      }
      pMVar5 = *(MessageLite **)((long)&local_30->field_0 + 0xd8);
      if (pMVar5 == (MessageLite *)0x0) {
        pvVar6 = Arena::CopyConstruct<google::protobuf::SourceCodeInfo>(arena,pMVar4);
        *(void **)((long)&local_30->field_0 + 0xd8) = pvVar6;
      }
      else {
        SourceCodeInfo::MergeImpl(pMVar5,pMVar4);
      }
    }
    if ((uVar1 & 0x20) != 0) {
      *(undefined4 *)((long)&local_30->field_0 + 0xe0) =
           *(undefined4 *)&from_msg[0xf]._vptr_MessageLite;
    }
  }
  (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
       (local_30->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_30->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void FileDescriptorProto::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<FileDescriptorProto*>(&to_msg);
  auto& from = static_cast<const FileDescriptorProto&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FileDescriptorProto)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_dependency()->MergeFrom(from._internal_dependency());
  _this->_internal_mutable_message_type()->MergeFrom(
      from._internal_message_type());
  _this->_internal_mutable_enum_type()->MergeFrom(
      from._internal_enum_type());
  _this->_internal_mutable_service()->MergeFrom(
      from._internal_service());
  _this->_internal_mutable_extension()->MergeFrom(
      from._internal_extension());
  _this->_internal_mutable_public_dependency()->MergeFrom(from._internal_public_dependency());
  _this->_internal_mutable_weak_dependency()->MergeFrom(from._internal_weak_dependency());
  _this->_internal_mutable_option_dependency()->MergeFrom(from._internal_option_dependency());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_name(from._internal_name());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_package(from._internal_package());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_syntax(from._internal_syntax());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(from._impl_.options_ != nullptr);
      if (_this->_impl_.options_ == nullptr) {
        _this->_impl_.options_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.options_);
      } else {
        _this->_impl_.options_->MergeFrom(*from._impl_.options_);
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(from._impl_.source_code_info_ != nullptr);
      if (_this->_impl_.source_code_info_ == nullptr) {
        _this->_impl_.source_code_info_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.source_code_info_);
      } else {
        _this->_impl_.source_code_info_->MergeFrom(*from._impl_.source_code_info_);
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.edition_ = from._impl_.edition_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}